

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

bool __thiscall wabt::WastLexer::ReadBlockComment(WastLexer *this,WastParser *parser)

{
  WastParser *this_00;
  bool bVar1;
  int iVar2;
  Location local_48;
  int local_24;
  WastParser *pWStack_20;
  int nesting;
  WastParser *parser_local;
  WastLexer *this_local;
  
  local_24 = 1;
  pWStack_20 = parser;
  parser_local = (WastParser *)this;
  do {
    while( true ) {
      while( true ) {
        iVar2 = ReadChar(this);
        this_00 = pWStack_20;
        if (iVar2 == -1) {
          GetLocation(&local_48,this);
          WastParser::Error(this_00,0x405219);
          return false;
        }
        if (iVar2 != 10) break;
        Newline(this);
      }
      if (iVar2 != 0x28) break;
      bVar1 = MatchChar(this,';');
      if (bVar1) {
        local_24 = local_24 + 1;
      }
    }
  } while (((iVar2 != 0x3b) || (bVar1 = MatchChar(this,')'), !bVar1)) ||
          (local_24 = local_24 + -1, local_24 != 0));
  return true;
}

Assistant:

bool WastLexer::ReadBlockComment(WastParser* parser) {
  int nesting = 1;
  while (true) {
    switch (ReadChar()) {
      case kEof:
        ERROR("EOF in block comment");
        return false;

      case ';':
        if (MatchChar(')') && --nesting == 0) {
          return true;
        }
        break;

      case '(':
        if (MatchChar(';')) {
          nesting++;
        }
        break;

      case '\n':
        Newline();
        break;
    }
  }
}